

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_test.cpp
# Opt level: O2

void flatbuffers::tests::MiniReflectFixedLengthArrayTest(void)

{
  Offset<MyGame::Example::ArrayTable> root;
  allocator<char> local_199;
  string local_198;
  string s;
  DetachedBuffer flatbuf;
  FlatBufferBuilder fbb;
  ArrayStruct aStruct;
  
  fbb.buf_.allocator_ = (Allocator *)0x0;
  fbb.buf_.own_allocator_ = false;
  fbb.buf_.initial_size_ = 0x400;
  fbb.buf_.max_size_ = 0x7fffffff;
  fbb.buf_.buffer_minalign_ = 8;
  fbb.buf_.reserved_ = 0;
  fbb.buf_.size_ = 0;
  fbb.length_of_64_bit_region_ = 0;
  fbb.nested = false;
  fbb.finished = false;
  fbb.buf_.buf_ = (uint8_t *)0x0;
  fbb.buf_.cur_._0_6_ = 0;
  fbb.buf_.cur_._6_2_ = 0;
  fbb.buf_.scratch_._0_6_ = 0;
  fbb._78_8_ = 0;
  fbb.minalign_ = 1;
  fbb.force_defaults_ = false;
  fbb.dedup_vtables_ = true;
  fbb.string_pool = (StringOffsetMap *)0x0;
  aStruct.a_ = 2.0;
  aStruct.b_[0] = 0;
  aStruct.b_[1] = 0;
  aStruct.b_[2] = 0;
  aStruct.b_[3] = 0;
  aStruct.b_[4] = 0;
  aStruct.b_[5] = 0;
  aStruct.b_[6] = 0;
  aStruct.b_[7] = 0;
  aStruct.b_[8] = 0;
  aStruct.b_[9] = 0;
  aStruct.b_[10] = 0;
  aStruct.b_[0xb] = 0;
  aStruct.b_[0xc] = 0;
  aStruct.b_[0xd] = 0;
  aStruct.b_[0xe] = 0;
  aStruct.c_ = '\f';
  aStruct._65_8_ = 0;
  aStruct.d_[0]._1_8_ = 0;
  aStruct.d_[0]._9_8_ = 0;
  aStruct.d_[0].d_._1_8_ = 0;
  aStruct.d_._25_8_ = 0;
  aStruct.d_[1]._1_8_ = 0;
  aStruct.d_[1]._9_8_ = 0;
  aStruct.d_[1].d_[0]._1_7_ = 0;
  aStruct.d_[1].d_[1]._0_1_ = 0;
  aStruct.d_[1].d_[1]._1_7_ = 0;
  aStruct.e_ = 1;
  aStruct._140_8_ = 0;
  aStruct.f_._4_8_ = 0;
  aStruct.f_[1]._4_4_ = 0;
  root = MyGame::Example::CreateArrayTable(&fbb,&aStruct);
  FlatBufferBuilderImpl<false>::Finish<MyGame::Example::ArrayTable>(&fbb,root,(char *)0x0);
  FlatBufferBuilderImpl<false>::Release(&flatbuf,&fbb);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_198,"",&local_199);
  FlatBufferToString(&s,flatbuf.cur_,(TypeTable *)MyGame::Example::ArrayTableTypeTable()::tt,false,
                     true,&local_198,false);
  std::__cxx11::string::~string((string *)&local_198);
  TestEqStr("{ a: { a: 2.0, b: [ 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0 ], c: 12, d: [ { a: [ 0, 0 ], b: A, c: [ A, A ], d: [ 0, 0 ] }, { a: [ 0, 0 ], b: A, c: [ A, A ], d: [ 0, 0 ] } ], e: 1, f: [ 0, 0 ] } }"
            ,s._M_dataplus._M_p,
            "\'\"{ \" \"a: { a: 2.0, \" \"b: [ 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0 ], \" \"c: 12, \" \"d: [ { a: [ 0, 0 ], b: A, c: [ A, A ], d: [ 0, 0 ] }, \" \"{ a: [ 0, 0 ], b: A, c: [ A, A ], d: [ 0, 0 ] } ], \" \"e: 1, f: [ 0, 0 ] } \" \"}\"\' != \'s.c_str()\'"
            ,
            "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/reflection_test.cpp"
            ,0x142,"");
  std::__cxx11::string::~string((string *)&s);
  DetachedBuffer::~DetachedBuffer(&flatbuf);
  FlatBufferBuilderImpl<false>::~FlatBufferBuilderImpl(&fbb);
  return;
}

Assistant:

void MiniReflectFixedLengthArrayTest() {
  // VS10 does not support typed enums, exclude from tests
#if !defined(_MSC_VER) || _MSC_VER >= 1700
  flatbuffers::FlatBufferBuilder fbb;
  MyGame::Example::ArrayStruct aStruct(2, 12, 1);
  auto aTable = MyGame::Example::CreateArrayTable(fbb, &aStruct);
  fbb.Finish(aTable);

  auto flatbuf = fbb.Release();
  auto s = flatbuffers::FlatBufferToString(
      flatbuf.data(), MyGame::Example::ArrayTableTypeTable());
  TEST_EQ_STR(
      "{ "
      "a: { a: 2.0, "
      "b: [ 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0 ], "
      "c: 12, "
      "d: [ { a: [ 0, 0 ], b: A, c: [ A, A ], d: [ 0, 0 ] }, "
      "{ a: [ 0, 0 ], b: A, c: [ A, A ], d: [ 0, 0 ] } ], "
      "e: 1, f: [ 0, 0 ] } "
      "}",
      s.c_str());
#endif
}